

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdisplay.c
# Opt level: O2

void xdpy_destroy_display_hook_default(ALLEGRO_DISPLAY *d,_Bool is_last)

{
  void *pvVar1;
  long lVar2;
  ALLEGRO_DISPLAY *pAVar3;
  _Bool _Var4;
  ALLEGRO_SYSTEM_XGLX *s;
  long *plVar5;
  bool bVar6;
  ulong uVar7;
  
  s = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
  if (*(long *)(d[1].es.__pad + 8) != 0) {
    glXDestroyContext(s->gfxdisplay);
    d[1].es.__pad[8] = 0;
    d[1].es.__pad[9] = 0;
    _Var4 = _al_trace_prefix("display",0,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
                             ,0x2bd,"xdpy_destroy_display_hook_default");
    if (_Var4) {
      _al_trace_suffix("destroy context.\n");
    }
  }
  pvVar1 = *(void **)(d[1].es.__pad + 0xe);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = *(void **)(d[1].es.__pad + 0xc);
    if (pvVar1 == (void *)0x0) goto LAB_001834ac;
    al_free_with_context
              (pvVar1,0x2c7,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
               ,"xdpy_destroy_display_hook_default");
  }
  else {
    al_free_with_context
              (pvVar1,0x2c1,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
               ,"xdpy_destroy_display_hook_default");
    d[1].es.__pad[0xe] = 0;
    d[1].es.__pad[0xf] = 0;
    XFree(*(undefined8 *)(d[1].es.__pad + 0xc));
  }
  d[1].es.__pad[0xc] = 0;
  d[1].es.__pad[0xd] = 0;
LAB_001834ac:
  lVar2 = *(long *)(d[1].es.__pad + 6);
  if ((lVar2 != 0) && (lVar2 != *(long *)(d[1].es.__pad + 2))) {
    glXDestroyWindow(s->x11display);
    d[1].es.__pad[6] = 0;
    d[1].es.__pad[7] = 0;
    _Var4 = _al_trace_prefix("display",0,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
                             ,0x2ce,"xdpy_destroy_display_hook_default");
    if (_Var4) {
      _al_trace_suffix("destroy glx window\n");
    }
  }
  pthread_cond_destroy((pthread_cond_t *)(d[1].es.__pad + 0x16));
  pthread_cond_destroy((pthread_cond_t *)(d[1].extra_settings.settings + 4));
  _Var4 = _al_trace_prefix("display",0,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
                           ,0x2d4,"xdpy_destroy_display_hook_default");
  if (_Var4) {
    _al_trace_suffix("destroy window.\n");
  }
  XDestroyWindow(s->x11display,*(undefined8 *)(d[1].es.__pad + 2));
  _al_xglx_unuse_adapter(s,d[1].es.__pad[5]);
  if ((d->flags & 2) != 0) {
    bVar6 = true;
    for (uVar7 = 0; uVar7 < (s->system).displays._size; uVar7 = uVar7 + 1) {
      plVar5 = (long *)_al_vector_ref(&(s->system).displays,(uint)uVar7);
      pAVar3 = (ALLEGRO_DISPLAY *)*plVar5;
      if ((pAVar3 != d) && (pAVar3[1].es.__pad[5] == d[1].es.__pad[5])) {
        bVar6 = (bool)(bVar6 & (pAVar3->flags & 2) == 0);
      }
    }
    if (bVar6) {
      _Var4 = _al_trace_prefix("display",0,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
                               ,0x2ab,"restore_mode_if_last_fullscreen_display");
      if (_Var4) {
        _al_trace_suffix("restore mode.\n");
      }
      _al_xglx_restore_video_mode(s,d[1].es.__pad[5]);
      return;
    }
    _Var4 = _al_trace_prefix("display",0,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/x/xdisplay.c"
                             ,0x2af,"restore_mode_if_last_fullscreen_display");
    if (_Var4) {
      _al_trace_suffix("*not* restoring mode.\n");
      return;
    }
  }
  return;
}

Assistant:

static void xdpy_destroy_display_hook_default(ALLEGRO_DISPLAY *d, bool is_last)
{
   ALLEGRO_SYSTEM_XGLX *s = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
   ALLEGRO_DISPLAY_XGLX *glx = (ALLEGRO_DISPLAY_XGLX *)d;
   (void)is_last;

   if (glx->context) {
      glXDestroyContext(s->gfxdisplay, glx->context);
      glx->context = NULL;
      ALLEGRO_DEBUG("destroy context.\n");
   }

   if (glx->fbc) {
      al_free(glx->fbc);
      glx->fbc = NULL;
      XFree(glx->xvinfo);
      glx->xvinfo = NULL;
   }
   else if (glx->xvinfo) {
      al_free(glx->xvinfo);
      glx->xvinfo = NULL;
   }

   if ((glx->glxwindow) && (glx->glxwindow != glx->window)) {
      glXDestroyWindow(s->x11display, glx->glxwindow);
      glx->glxwindow = 0;
      ALLEGRO_DEBUG("destroy glx window\n");
   }

   _al_cond_destroy(&glx->mapped);
   _al_cond_destroy(&glx->selectioned);

   ALLEGRO_DEBUG("destroy window.\n");
   XDestroyWindow(s->x11display, glx->window);

   _al_xglx_unuse_adapter(s, glx->adapter);

   if (d->flags & ALLEGRO_FULLSCREEN) {
      restore_mode_if_last_fullscreen_display(s, glx);
   }
}